

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.cpp
# Opt level: O0

void __thiscall r_exec::HLPController::HLPController(HLPController *this,View *view)

{
  char cVar1;
  ushort uVar2;
  HLPBindingMap *pHVar3;
  Code *hlp;
  uint64_t uVar4;
  undefined8 in_RCX;
  undefined8 extraout_RDX;
  Code *object;
  View *view_local;
  HLPController *this_local;
  
  OController::OController(&this->super_OController,view);
  (this->super_OController).super_Controller.super__Object._vptr__Object =
       (_func_int **)&PTR__HLPController_002ec038;
  this->strong_requirement_count = 0;
  this->weak_requirement_count = 0;
  this->requirement_count = 0;
  Cache<r_exec::HLPController::EEntry>::Cache(&this->evidences);
  Cache<r_exec::HLPController::PEEntry>::Cache(&this->predicted_evidences);
  core::P<r_exec::HLPBindingMap>::P(&this->bindings);
  std::vector<core::P<r_exec::HLPController>,_std::allocator<core::P<r_exec::HLPController>_>_>::
  vector(&this->controllers);
  pHVar3 = (HLPBindingMap *)operator_new(0x40);
  HLPBindingMap::HLPBindingMap(pHVar3);
  core::P<r_exec::HLPBindingMap>::operator=(&this->bindings,pHVar3);
  hlp = get_unpacked_object(this);
  pHVar3 = core::P<r_exec::HLPBindingMap>::operator->(&this->bindings);
  HLPBindingMap::init_from_hlp(pHVar3,hlp);
  (*(hlp->super__Object)._vptr__Object[4])(hlp,1);
  uVar2 = r_code::Atom::asIndex();
  (*(hlp->super__Object)._vptr__Object[4])
            (hlp,(ulong)uVar2,extraout_RDX,CONCAT62((int6)((ulong)in_RCX >> 0x10),uVar2));
  cVar1 = r_code::Atom::getAtomCount();
  this->_has_tpl_args = cVar1 != '\0';
  this->ref_count = 0;
  uVar4 = (*Now)();
  this->last_match_time = uVar4;
  return;
}

Assistant:

HLPController::HLPController(r_code::View *view): OController(view), strong_requirement_count(0), weak_requirement_count(0), requirement_count(0)
{
    bindings = new HLPBindingMap();
    Code *object = get_unpacked_object();
    bindings->init_from_hlp(object); // init a binding map from the patterns.
    _has_tpl_args = object->code(object->code(HLP_TPL_ARGS).asIndex()).getAtomCount() > 0;
    ref_count = 0;
    last_match_time = Now();
}